

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2149.c
# Opt level: O1

void PSG_writeReg(PSG_conflict *psg,UINT32 reg,UINT32 val)

{
  uint uVar1;
  UINT32 UVar2;
  ulong uVar3;
  
  if (reg < 0x10) {
    uVar3 = (ulong)reg;
    psg->reg[uVar3] = (UINT8)val;
    switch(uVar3) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
      psg->freq[reg >> 1] = (uint)psg->reg[reg & 0xe] | (psg->reg[uVar3 | 1] & 0xf) << 8;
      return;
    case 6:
      uVar1 = 1;
      if (val != 0) {
        uVar1 = val * 2 & 0x3e;
      }
      psg->noise_freq = uVar1;
      return;
    case 7:
      psg->tmask[0] = val & 1;
      psg->tmask[1] = val & 2;
      psg->tmask[2] = val & 4;
      psg->nmask[0] = val & 8;
      psg->nmask[1] = val & 0x10;
      psg->nmask[2] = val & 0x20;
      return;
    case 8:
    case 9:
    case 10:
      psg->volume[reg - 8] = val * 2;
      return;
    case 0xb:
    case 0xc:
      psg->env_freq = (uint)*(ushort *)(psg->reg + 0xb);
      return;
    case 0xd:
      psg->env_continue = val >> 3 & 1;
      uVar1 = val >> 2 & 1;
      psg->env_attack = uVar1;
      psg->env_alternate = val >> 1 & 1;
      psg->env_hold = val & 1;
      psg->env_face = uVar1;
      psg->env_pause = 0;
      psg->env_count = 0x10000 - psg->env_freq;
      UVar2 = 0x1f;
      if (uVar1 != 0) {
        UVar2 = 0;
      }
      psg->env_ptr = UVar2;
      return;
    }
  }
  return;
}

Assistant:

EMU2149_API void
PSG_writeReg (PSG * psg, UINT32 reg, UINT32 val)
{
  int c;

  if (reg > 15) return;

  psg->reg[reg] = (UINT8) (val & 0xff);
  switch (reg)
  {
  case 0:
  case 2:
  case 4:
  case 1:
  case 3:
  case 5:
    c = reg >> 1;
    psg->freq[c] = ((psg->reg[c * 2 + 1] & 15) << 8) + psg->reg[c * 2];
    break;

  case 6:
    psg->noise_freq = (val == 0) ? 1 : ((val & 31) << 1);
    break;

  case 7:
    psg->tmask[0] = (val & 1);
    psg->tmask[1] = (val & 2);
    psg->tmask[2] = (val & 4);
    psg->nmask[0] = (val & 8);
    psg->nmask[1] = (val & 16);
    psg->nmask[2] = (val & 32);
    break;

  case 8:
  case 9:
  case 10:
    psg->volume[reg - 8] = val << 1;

    break;

  case 11:
  case 12:
    psg->env_freq = (psg->reg[12] << 8) + psg->reg[11];
    break;

  case 13:
    psg->env_continue = (val >> 3) & 1;
    psg->env_attack = (val >> 2) & 1;
    psg->env_alternate = (val >> 1) & 1;
    psg->env_hold = val & 1;
    psg->env_face = psg->env_attack;
    psg->env_pause = 0;
    psg->env_count = 0x10000 - psg->env_freq;
    psg->env_ptr = psg->env_face?0:0x1f;
    break;

  case 14:
  case 15:
  default:
    break;
  }

  return;
}